

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

void __thiscall re2::Prog::Fanout(Prog *this,SparseArray<int> *fanout)

{
  uint *puVar1;
  iterator pIVar2;
  bool bVar3;
  uint uVar4;
  InstOp IVar5;
  int iVar6;
  iterator pIVar7;
  char *pcVar8;
  uint *puVar9;
  ostream *poVar10;
  int __c;
  SparseArray<int> *in_RSI;
  Prog *in_RDI;
  Inst *ip;
  int id;
  iterator j;
  int *count;
  iterator i;
  SparseSet reachable;
  int in_stack_fffffffffffffd4c;
  uint in_stack_fffffffffffffd50;
  int in_stack_fffffffffffffd54;
  uint in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  undefined8 in_stack_fffffffffffffd68;
  SparseArray<int> *this_00;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  InstOp in_stack_fffffffffffffd84;
  ostream *in_stack_fffffffffffffd88;
  LogMessage *in_stack_fffffffffffffd90;
  LogMessage local_1f0;
  Inst *local_70;
  uint local_64;
  uint *local_60;
  int *local_58;
  iterator local_50;
  undefined4 local_48;
  SparseSetT<void> local_38;
  SparseArray<int> *local_10;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  local_10 = in_RSI;
  size(in_RDI);
  SparseSetT<void>::SparseSetT
            ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),iVar6
            );
  SparseArray<int>::clear(local_10);
  uVar4 = start(in_RDI);
  pcVar8 = (char *)(ulong)uVar4;
  local_48 = 0;
  SparseArray<int>::set_new
            ((SparseArray<int> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
             in_stack_fffffffffffffd4c,(int *)0x255197);
  for (local_50 = SparseArray<int>::begin((SparseArray<int> *)0x2551a6); pIVar2 = local_50,
      pIVar7 = SparseArray<int>::end
                         ((SparseArray<int> *)
                          CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)),
      pIVar2 != pIVar7; local_50 = local_50 + 1) {
    local_58 = SparseArray<int>::IndexValue::value(local_50);
    SparseSetT<void>::clear(&local_38);
    pcVar8 = SparseArray<int>::IndexValue::index(local_50,pcVar8,__c);
    pcVar8 = (char *)((ulong)pcVar8 & 0xffffffff);
    SparseSetT<void>::insert
              ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd4c);
    for (local_60 = (uint *)SparseSetT<void>::begin((SparseSetT<void> *)0x25526f); puVar1 = local_60
        , puVar9 = (uint *)SparseSetT<void>::end
                                     ((SparseSetT<void> *)
                                      CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50))
        , puVar1 != puVar9; local_60 = local_60 + 1) {
      local_64 = *local_60;
      pcVar8 = (char *)(ulong)local_64;
      local_70 = inst((Prog *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                      in_stack_fffffffffffffd4c);
      IVar5 = Inst::opcode(local_70);
      switch(IVar5) {
      case kInstAltMatch:
        pcVar8 = (char *)(ulong)(local_64 + 1);
        SparseSetT<void>::insert
                  ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)
                   ,in_stack_fffffffffffffd4c);
        break;
      case kInstByteRange:
        iVar6 = Inst::last(local_70);
        if (iVar6 == 0) {
          SparseSetT<void>::insert
                    ((SparseSetT<void> *)
                     CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd4c);
        }
        *local_58 = *local_58 + 1;
        this_00 = local_10;
        uVar4 = Inst::out(local_70);
        pcVar8 = (char *)(ulong)uVar4;
        bVar3 = SparseArray<int>::has_index(this_00,in_stack_fffffffffffffd64);
        in_stack_fffffffffffffd64 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd64);
        if (!bVar3) {
          in_stack_fffffffffffffd60 = Inst::out(local_70);
          pcVar8 = (char *)(ulong)in_stack_fffffffffffffd60;
          SparseArray<int>::set_new
                    ((SparseArray<int> *)
                     CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                     in_stack_fffffffffffffd4c,(int *)0x2554c0);
        }
        break;
      case kInstCapture:
      case kInstEmptyWidth:
      case kInstNop:
        in_stack_fffffffffffffd54 = Inst::last(local_70);
        if (in_stack_fffffffffffffd54 == 0) {
          SparseSetT<void>::insert
                    ((SparseSetT<void> *)(ulong)in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c)
          ;
        }
        in_stack_fffffffffffffd50 = Inst::out(local_70);
        pcVar8 = (char *)(ulong)in_stack_fffffffffffffd50;
        SparseSetT<void>::insert
                  ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)
                   ,in_stack_fffffffffffffd4c);
        break;
      case kInstMatch:
        in_stack_fffffffffffffd4c = Inst::last(local_70);
        if (in_stack_fffffffffffffd4c == 0) {
          pcVar8 = (char *)(ulong)(local_64 + 1);
          SparseSetT<void>::insert
                    ((SparseSetT<void> *)
                     CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),0);
        }
        break;
      case kInstFail:
        break;
      default:
        LogMessage::LogMessage
                  (in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88,
                   in_stack_fffffffffffffd84);
        in_stack_fffffffffffffd90 = (LogMessage *)LogMessage::stream(&local_1f0);
        in_stack_fffffffffffffd88 =
             std::operator<<((ostream *)in_stack_fffffffffffffd90,"unhandled ");
        in_stack_fffffffffffffd84 = Inst::opcode(local_70);
        poVar10 = (ostream *)
                  std::ostream::operator<<(in_stack_fffffffffffffd88,in_stack_fffffffffffffd84);
        pcVar8 = " in Prog::Fanout()";
        std::operator<<(poVar10," in Prog::Fanout()");
        LogMessage::~LogMessage
                  ((LogMessage *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      }
    }
  }
  SparseSetT<void>::~SparseSetT
            ((SparseSetT<void> *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  return;
}

Assistant:

void Prog::Fanout(SparseArray<int>* fanout) {
  DCHECK_EQ(fanout->max_size(), size());
  SparseSet reachable(size());
  fanout->clear();
  fanout->set_new(start(), 0);
  for (SparseArray<int>::iterator i = fanout->begin(); i != fanout->end(); ++i) {
    int* count = &i->value();
    reachable.clear();
    reachable.insert(i->index());
    for (SparseSet::iterator j = reachable.begin(); j != reachable.end(); ++j) {
      int id = *j;
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled " << ip->opcode() << " in Prog::Fanout()";
          break;

        case kInstByteRange:
          if (!ip->last())
            reachable.insert(id+1);

          (*count)++;
          if (!fanout->has_index(ip->out())) {
            fanout->set_new(ip->out(), 0);
          }
          break;

        case kInstAltMatch:
          DCHECK(!ip->last());
          reachable.insert(id+1);
          break;

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last())
            reachable.insert(id+1);

          reachable.insert(ip->out());
          break;

        case kInstMatch:
          if (!ip->last())
            reachable.insert(id+1);
          break;

        case kInstFail:
          break;
      }
    }
  }
}